

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzer.cpp
# Opt level: O2

void __thiscall HdlcAnalyzer::BitSyncProcessFlags(HdlcAnalyzer *this)

{
  bool bVar1;
  char cVar2;
  BitState BVar3;
  U64 UVar4;
  long lVar5;
  reference pvVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  vector<HdlcByte,_std::allocator<HdlcByte>_> flags;
  Frame frame;
  
  flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  bVar7 = false;
LAB_0010996a:
  do {
    bVar1 = AbortComing(this);
    if (bVar1) {
      for (uVar8 = 0; uVar9 = (ulong)uVar8,
          uVar9 < (ulong)(((long)flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>.
                                _M_impl.super__Vector_impl_data._M_start) / 0x18); uVar8 = uVar8 + 1
          ) {
        pvVar6 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::at(&flags,uVar9);
        UVar4 = pvVar6->startSample;
        std::vector<HdlcByte,_std::allocator<HdlcByte>_>::at(&flags,uVar9);
        Frame::Frame(&frame);
        _frame = UVar4;
        std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,&frame);
        Frame::~Frame(&frame);
      }
      if (flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
          super__Vector_impl_data._M_start) {
        flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
        super__Vector_impl_data._M_finish =
             flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>._M_impl.
             super__Vector_impl_data._M_start;
      }
      UVar4 = AnalyzerChannelData::GetSampleNumber();
      lVar5 = AnalyzerChannelData::GetSampleNumber();
      uVar8 = this->mSamplesIn8Bits;
      Frame::Frame(&frame);
      *(undefined8 *)&this->field_0xa8 = 0;
      *(undefined8 *)&this->field_0xb0 = 0;
      *(undefined2 *)&this->field_0xb8 = 7;
      *(U64 *)&this->mAbtFrame = UVar4;
      *(ulong *)&this->field_0xa0 = lVar5 + (ulong)uVar8;
      _frame = UVar4;
      Frame::~Frame(&frame);
      AnalyzerChannelData::AdvanceToNextEdge();
      this->mAbortFrame = true;
LAB_00109bcc:
      std::_Vector_base<HdlcByte,_std::allocator<HdlcByte>_>::~_Vector_base
                (&flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>);
      return;
    }
    bVar1 = FlagComing(this);
    if (bVar1) {
      _frame = AnalyzerChannelData::GetSampleNumber();
      AnalyzerChannelData::AdvanceToNextEdge();
      AnalyzerChannelData::GetSampleNumber();
      std::vector<HdlcByte,_std::allocator<HdlcByte>_>::push_back(&flags,(value_type *)&frame);
      cVar2 = AnalyzerChannelData::WouldAdvancingCauseTransition((uint)this->mHdlc);
      uVar8 = (uint)this->mHdlc;
      if (cVar2 == '\0') {
        AnalyzerChannelData::Advance(uVar8);
        BVar3 = AnalyzerChannelData::GetBitState();
        this->mPreviousBitState = BVar3;
        AnalyzerChannelData::Advance((uint)this->mHdlc);
        bVar7 = bVar1;
      }
      else {
        AnalyzerChannelData::Advance(uVar8);
        BVar3 = AnalyzerChannelData::GetBitState();
        this->mPreviousBitState = BVar3;
        AnalyzerChannelData::AdvanceToNextEdge();
        bVar7 = bVar1;
      }
      goto LAB_0010996a;
    }
    if (bVar7 != false) {
      if ((this->mAbortFrame & 1U) == 0) {
        for (uVar8 = 0; uVar9 = (ulong)uVar8,
            uVar9 < (ulong)(((long)flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)flags.super__Vector_base<HdlcByte,_std::allocator<HdlcByte>_>.
                                  _M_impl.super__Vector_impl_data._M_start) / 0x18);
            uVar8 = uVar8 + 1) {
          pvVar6 = std::vector<HdlcByte,_std::allocator<HdlcByte>_>::at(&flags,uVar9);
          UVar4 = pvVar6->startSample;
          std::vector<HdlcByte,_std::allocator<HdlcByte>_>::at(&flags,uVar9);
          Frame::Frame(&frame);
          _frame = UVar4;
          std::vector<Frame,_std::allocator<Frame>_>::push_back(&this->mResultFrames,&frame);
          Frame::~Frame(&frame);
        }
      }
      goto LAB_00109bcc;
    }
    AnalyzerChannelData::AdvanceToNextEdge();
    bVar7 = bVar1;
  } while( true );
}

Assistant:

void HdlcAnalyzer::BitSyncProcessFlags()
{
    bool flagEncountered = false;
    vector<HdlcByte> flags;
    for( ;; )
    {
        if( AbortComing() )
        {
            // Show fill flags
            for( U32 i = 0; i < flags.size(); ++i )
            {
                Frame frame = CreateFrame( HDLC_FIELD_FLAG, flags.at( i ).startSample, flags.at( i ).endSample, HDLC_FLAG_FILL );
                AddFrameToResults( frame );
            }
            flags.clear();

            mAbtFrame = CreateFrame( HDLC_ABORT_SEQ, mHdlc->GetSampleNumber(), mHdlc->GetSampleNumber() + mSamplesIn8Bits );

            mHdlc->AdvanceToNextEdge();
            flagEncountered = false;
            mAbortFrame = true;

            break;
        }

        if( FlagComing() )
        {
            HdlcByte bs;
            bs.value = 0;

            bs.startSample = mHdlc->GetSampleNumber();
            mHdlc->AdvanceToNextEdge();
            bs.endSample = mHdlc->GetSampleNumber();

            flags.push_back( bs );

            if( mHdlc->WouldAdvancingCauseTransition( mSamplesInHalfPeriod * 1.5 ) )
            {
                mHdlc->Advance( mSamplesInHalfPeriod * 0.5 );
                mPreviousBitState = mHdlc->GetBitState();
                mHdlc->AdvanceToNextEdge();
            }
            else
            {
                mHdlc->Advance( mSamplesInHalfPeriod * 0.5 );
                mPreviousBitState = mHdlc->GetBitState();
                mHdlc->Advance( mSamplesInHalfPeriod * 0.5 );
            }

            flagEncountered = true;
        }
        else // non-flag
        {
            if( flagEncountered )
            {
                break;
            }
            else // non-flag byte before a byte-flag is ignored
            {
                mHdlc->AdvanceToNextEdge();
            }
        }
    }

    if( !mAbortFrame )
    {
        for( U32 i = 0; i < flags.size(); ++i )
        {
            Frame frame = CreateFrame( HDLC_FIELD_FLAG, flags.at( i ).startSample, flags.at( i ).endSample, HDLC_FLAG_FILL );
            if( i == flags.size() - 1 )
            {
                frame.mData1 = HDLC_FLAG_START;
            }
            AddFrameToResults( frame );
        }
    }
}